

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void __thiscall
cilk_fiber::remove_reference_from_self_and_resume_other
          (cilk_fiber *this,cilk_fiber_pool *self_pool,cilk_fiber *other)

{
  bool bVar1;
  cilk_fiber_sysdep *this_00;
  cilk_fiber *in_RDX;
  cilk_fiber_pool *in_RSI;
  cilk_fiber *in_RDI;
  cilk_fiber_sysdep *self;
  cilk_fiber_sysdep *in_stack_ffffffffffffffc8;
  
  dec_ref_count(in_RDI);
  inc_ref_count(in_RDX);
  in_RDX->m_pending_remove_ref = in_RDI;
  in_RDX->m_pending_pool = in_RSI;
  (in_RDX->super_cilk_fiber_data).owner = (in_RDI->super_cilk_fiber_data).owner;
  (in_RDI->super_cilk_fiber_data).owner = (__cilkrts_worker *)0x0;
  bVar1 = is_resumable(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = sysdep(in_RDI);
    sysdep(in_RDX);
    cilk_fiber_sysdep::jump_to_resume_other_sysdep(this_00,in_stack_ffffffffffffffc8);
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                ,0x3c2,"!this->is_resumable()");
}

Assistant:

NORETURN
cilk_fiber::remove_reference_from_self_and_resume_other(cilk_fiber_pool* self_pool,
                                                        cilk_fiber*      other)
{
    // Decrement my reference count once (to suspend)
    // Increment other's count (to resume)
    // Suspended fiber should have a reference count of at least 1.  (It is not in a pool).
    this->dec_ref_count();
    other->inc_ref_count();

    // Set a pending remove reference for this fiber, once we have
    // actually switched off.
    other->m_pending_remove_ref = this;
    other->m_pending_pool   = self_pool;

    // Pass along my owner.
    other->owner = this->owner;
    this->owner  = NULL;

    // Since we are deallocating self, this fiber does not become
    // resumable.
    CILK_ASSERT(!this->is_resumable());

    cilk_fiber_sysdep* self = this->sysdep();
    self->jump_to_resume_other_sysdep(other->sysdep());

    __cilkrts_bug("Deallocating fiber.  We should never come back here.");
    std::abort();
}